

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

TRef lj_opt_fwd_alen(jit_State *J)

{
  ushort uVar1;
  IRIns *pIVar2;
  ushort uVar3;
  int iVar4;
  AliasRet AVar5;
  TRef TVar6;
  ulong uVar7;
  ushort uVar8;
  
  uVar1 = (J->fold).ins.field_0.op1;
  uVar8 = J->chain[0x4b];
  uVar3 = uVar1;
  if (uVar1 < uVar8) {
    pIVar2 = (J->cur).ir;
    do {
      uVar7 = (ulong)*(ushort *)((long)pIVar2 + (ulong)pIVar2[uVar8].field_0.op1 * 8 + 2);
      if (*(char *)((long)pIVar2 + uVar7 * 8 + 5) == '\x1e') {
        uVar7 = (ulong)pIVar2[uVar7].field_0.op1;
      }
      uVar3 = uVar8;
    } while (((*(byte *)((long)pIVar2 + uVar7 * 8 + 4) & 0x1f) != 0xe) &&
            (uVar8 = *(ushort *)((long)pIVar2 + (ulong)uVar8 * 8 + 6), uVar3 = uVar1, uVar1 < uVar8)
            );
  }
  uVar8 = J->chain[0x49];
  if (uVar3 < uVar8) {
    pIVar2 = (J->cur).ir;
    do {
      if (pIVar2[uVar8].field_0.op1 == uVar1) {
        iVar4 = fwd_aa_tab_clear(J,(uint)uVar8,(uint)uVar1);
        if (iVar4 != 0) {
          uVar3 = J->chain[0x4a];
          goto LAB_0011c32c;
        }
        break;
      }
      uVar8 = *(ushort *)((long)pIVar2 + (ulong)uVar8 * 8 + 6);
    } while (uVar3 < uVar8);
  }
LAB_0011c3ae:
  TVar6 = lj_ir_emit(J);
  return TVar6;
LAB_0011c32c:
  if (uVar3 <= uVar8) {
    return (uint)uVar8;
  }
  uVar7 = (ulong)uVar3;
  if (uVar1 == pIVar2[pIVar2[pIVar2[uVar7].field_0.op1].field_0.op1].field_0.op1) {
    if ((*(byte *)((long)pIVar2 + uVar7 * 8 + 4) & 0x1f) != 0) {
      uVar1 = *(ushort *)((long)pIVar2 + (ulong)pIVar2[uVar7].field_0.op1 * 8 + 2);
      uVar7 = (ulong)uVar1;
      if ((((*(char *)((long)pIVar2 + uVar7 * 8 + 5) == ')') && (pIVar2[uVar7].field_0.op1 == uVar8)
           ) && (uVar7 = (ulong)*(ushort *)((long)pIVar2 + uVar7 * 8 + 2),
                *(char *)((long)pIVar2 + uVar7 * 8 + 5) == '\x17')) &&
         (pIVar2[uVar7].field_1.op12 == 1)) {
        (J->fold).ins.field_0.op2 = uVar1;
      }
    }
    goto LAB_0011c3ae;
  }
  AVar5 = aa_table((jit_State *)&pIVar2->field_0,(uint)uVar1,
                   (uint)pIVar2[pIVar2[pIVar2[uVar7].field_0.op1].field_0.op1].field_0.op1);
  if (AVar5 != ALIAS_NO) goto LAB_0011c3ae;
  uVar3 = *(ushort *)((long)pIVar2 + uVar7 * 8 + 6);
  goto LAB_0011c32c;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_alen(jit_State *J)
{
  IRRef tab = fins->op1;  /* Table reference. */
  IRRef lim = tab;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting HSTORE with numeric key. */
  ref = J->chain[IR_HSTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    IRIns *href = IR(store->op1);
    IRIns *key = IR(href->op2);
    if (irt_isnum(key->o == IR_KSLOT ? IR(key->op1)->t : key->t)) {
      lim = ref;  /* Conflicting store found, limits search for ALEN. */
      break;
    }
    ref = store->prev;
  }

  /* Try to find a matching ALEN. */
  ref = J->chain[IR_ALEN];
  while (ref > lim) {
    /* CSE for ALEN only depends on the table, not the hint. */
    if (IR(ref)->op1 == tab) {
      IRRef sref;

      /* Search for aliasing table.clear. */
      if (!fwd_aa_tab_clear(J, ref, tab))
	break;

      /* Search for hint-forwarding or conflicting store. */
      sref = J->chain[IR_ASTORE];
      while (sref > ref) {
	IRIns *store = IR(sref);
	IRIns *aref = IR(store->op1);
	IRIns *fref = IR(aref->op1);
	if (tab == fref->op1) {  /* ASTORE to the same table. */
	  /* Detect t[#t+1] = x idiom for push. */
	  IRIns *idx = IR(aref->op2);
	  if (!irt_isnil(store->t) &&
	      idx->o == IR_ADD && idx->op1 == ref &&
	      IR(idx->op2)->o == IR_KINT && IR(idx->op2)->i == 1) {
	    /* Note: this requires an extra PHI check in loop unroll. */
	    fins->op2 = aref->op2;  /* Set ALEN hint. */
	  }
	  goto doemit;  /* Conflicting store, possibly giving a hint. */
	} else if (aa_table(J, tab, fref->op1) != ALIAS_NO) {
	  goto doemit;  /* Conflicting store. */
	}
	sref = store->prev;
      }

      return ref;  /* Plain ALEN forwarding. */
    }
    ref = IR(ref)->prev;
  }
doemit:
  return EMITFOLD;
}